

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O0

void fix_rlimit(void)

{
  string_view_t fmt;
  int iVar1;
  rlimit limit;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  size_t local_8;
  
  iVar1 = getrlimit(RLIMIT_NOFILE,(rlimit *)&stack0xfffffffffffffff0);
  if (iVar1 == 0) {
    iVar1 = setrlimit(RLIMIT_NOFILE,(rlimit *)&stack0xfffffffffffffff0);
    if (iVar1 == 0) {
      ::fmt::v6::basic_string_view<char>::basic_string_view
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      fmt.size_ = local_8;
      fmt.data_ = in_stack_ffffffffffffffe8;
      spdlog::debug<unsigned_long>(fmt,(unsigned_long *)in_stack_ffffffffffffffe0);
    }
    else {
      spdlog::warn<char[19]>((char (*) [19])0x113140);
    }
  }
  else {
    spdlog::warn<char[19]>((char (*) [19])0x113114);
  }
  return;
}

Assistant:

void fix_rlimit() {
    struct rlimit limit;

    if (getrlimit(RLIMIT_NOFILE, &limit) != 0) {
        spdlog::warn("getrlimit() failed");
        return;
    }

    limit.rlim_cur = limit.rlim_max;
    if (setrlimit(RLIMIT_NOFILE, &limit) != 0) {
        spdlog::warn("setrlimit() failed");
        return;
    }

    spdlog::debug("RLIMIT_NOFILE updated: {}", limit.rlim_cur);
}